

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::DisconnectNode(CConnman *this,NodeId id)

{
  long lVar1;
  pointer ppCVar2;
  CNode *pCVar3;
  pointer ppCVar4;
  bool bVar5;
  pointer ppCVar6;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  NodeId local_40;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock94;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock94,&this->m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xe2f,false);
  ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar4 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppCVar6 = ppCVar4;
    if (ppCVar6 == ppCVar2) goto LAB_0071ac74;
    pCVar3 = *ppCVar6;
    ppCVar4 = ppCVar6 + 1;
  } while (pCVar3->id != id);
  bVar5 = ::LogAcceptCategory(NET,Debug);
  if (bVar5) {
    local_40 = pCVar3->id;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x50;
    logging_function._M_str = "DisconnectNode";
    logging_function._M_len = 0xe;
    LogPrintf_<long>(logging_function,source_file,0xe32,NET,Debug,
                     "disconnect by id peer=%d; disconnecting\n",&local_40);
  }
  LOCK();
  (pCVar3->fDisconnect)._M_base._M_i = true;
  UNLOCK();
LAB_0071ac74:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock94.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ppCVar6 != ppCVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(NodeId id)
{
    LOCK(m_nodes_mutex);
    for(CNode* pnode : m_nodes) {
        if (id == pnode->GetId()) {
            LogDebug(BCLog::NET, "disconnect by id peer=%d; disconnecting\n", pnode->GetId());
            pnode->fDisconnect = true;
            return true;
        }
    }
    return false;
}